

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.cpp
# Opt level: O3

uint __thiscall o3dgc::Arithmetic_Codec::decode(Arithmetic_Codec *this,Adaptive_Data_Model *M)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  byte *pbVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  bool bVar12;
  
  uVar10 = this->length;
  if (M->decoder_table == (uint *)0x0) {
    uVar9 = uVar10 >> 0xf;
    this->length = uVar9;
    uVar5 = M->data_symbols;
    uVar11 = uVar5 >> 1;
    uVar8 = this->value;
    uVar3 = 0;
    uVar6 = 0;
    do {
      uVar7 = M->distribution[uVar11] * uVar9;
      uVar2 = uVar11;
      if (uVar7 <= uVar8) {
        uVar2 = uVar5;
        uVar3 = uVar7;
        uVar7 = uVar10;
        uVar6 = uVar11;
      }
      uVar10 = uVar7;
      uVar5 = uVar2;
      uVar11 = uVar6 + uVar5 >> 1;
    } while (uVar11 != uVar6);
  }
  else {
    uVar8 = this->value;
    uVar9 = uVar10 >> 0xf;
    this->length = uVar9;
    uVar5 = uVar8 / uVar9 >> ((byte)M->table_shift & 0x1f);
    puVar1 = M->distribution;
    uVar6 = M->decoder_table[uVar5];
    uVar5 = M->decoder_table[uVar5 + 1] + 1;
    while (uVar3 = uVar5, uVar6 + 1 < uVar3) {
      uVar5 = uVar3 + uVar6 >> 1;
      if (puVar1[uVar5] <= uVar8 / uVar9) {
        uVar6 = uVar5;
        uVar5 = uVar3;
      }
    }
    uVar3 = puVar1[uVar6] * uVar9;
    if (uVar6 != M->last_symbol) {
      uVar10 = uVar9 * puVar1[uVar6 + 1];
    }
  }
  uVar8 = uVar8 - uVar3;
  this->value = uVar8;
  uVar10 = uVar10 - uVar3;
  this->length = uVar10;
  if (uVar10 < 0x1000000) {
    pbVar4 = this->ac_pointer;
    do {
      pbVar4 = pbVar4 + 1;
      this->ac_pointer = pbVar4;
      uVar8 = uVar8 << 8 | (uint)*pbVar4;
      this->value = uVar8;
      this->length = uVar10 << 8;
      bVar12 = uVar10 < 0x10000;
      uVar10 = uVar10 << 8;
    } while (bVar12);
  }
  M->symbol_count[uVar6] = M->symbol_count[uVar6] + 1;
  puVar1 = &M->symbols_until_update;
  *puVar1 = *puVar1 - 1;
  if (*puVar1 == 0) {
    Adaptive_Data_Model::update(M,false);
  }
  return uVar6;
}

Assistant:

unsigned Arithmetic_Codec::decode(Adaptive_Data_Model & M)
    {
    #ifdef _DEBUG
      if (mode != 2) AC_Error("decoder not initialized");
    #endif

      unsigned n, s, x, y = length;

      if (M.decoder_table) {              // use table look-up for faster decoding

        unsigned dv = value / (length >>= DM__LengthShift);
        unsigned t = dv >> M.table_shift;

        s = M.decoder_table[t];         // initial decision based on table look-up
        n = M.decoder_table[t+1] + 1;

        while (n > s + 1) {                        // finish with bisection search
          unsigned m = (s + n) >> 1;
          if (M.distribution[m] > dv) n = m; else s = m;
        }
                                                               // compute products
        x = M.distribution[s] * length;
        if (s != M.last_symbol) {
            y = M.distribution[s+1] * length;
        }
      }

      else {                                  // decode using only multiplications

        x = s = 0;
        length >>= DM__LengthShift;
        unsigned m = (n = M.data_symbols) >> 1;
                                                    // decode via bisection search
        do {
          unsigned z = length * M.distribution[m];
          if (z > value) {
            n = m;
            y = z;                                             // value is smaller
          }
          else {
            s = m;
            x = z;                                     // value is larger or equal
          }
        } while ((m = (s + n) >> 1) != s);
      }

      value -= x;                                               // update interval
      length = y - x;

      if (length < AC__MinLength) renorm_dec_interval();        // renormalization

      ++M.symbol_count[s];
      if (--M.symbols_until_update == 0) M.update(false);  // periodic model update

      return s;
    }